

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume_mesh_color_quantity.cpp
# Opt level: O3

void __thiscall
polyscope::VolumeMeshColorQuantity::VolumeMeshColorQuantity
          (VolumeMeshColorQuantity *this,string *name,VolumeMesh *mesh_,string *definedOn_,
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          *colorValues_)

{
  pointer pcVar1;
  string local_50;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + name->_M_string_length);
  VolumeMeshQuantity::VolumeMeshQuantity(&this->super_VolumeMeshQuantity,&local_50,mesh_,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  (this->super_VolumeMeshQuantity).super_QuantityS<polyscope::VolumeMesh>.super_Quantity.
  _vptr_Quantity = (_func_int **)&PTR__VolumeMeshColorQuantity_005f5970;
  ColorQuantity<polyscope::VolumeMeshColorQuantity>::ColorQuantity
            (&this->super_ColorQuantity<polyscope::VolumeMeshColorQuantity>,this,colorValues_);
  (this->super_VolumeMeshQuantity).super_QuantityS<polyscope::VolumeMesh>.super_Quantity.
  _vptr_Quantity = (_func_int **)&PTR__VolumeMeshColorQuantity_005f5970;
  (this->definedOn)._M_dataplus._M_p = (pointer)&(this->definedOn).field_2;
  pcVar1 = (definedOn_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->definedOn,pcVar1,pcVar1 + definedOn_->_M_string_length);
  (this->program).super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->program).super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->sliceProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->sliceProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

VolumeMeshColorQuantity::VolumeMeshColorQuantity(std::string name, VolumeMesh& mesh_, std::string definedOn_,
                                                 const std::vector<glm::vec3>& colorValues_)
    : VolumeMeshQuantity(name, mesh_, true), ColorQuantity(*this, colorValues_), definedOn(definedOn_) {}